

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnp.cpp
# Opt level: O3

void __thiscall
libtorrent::upnp::on_upnp_xml
          (upnp *this,error_code *e,http_parser *p,rootdevice *d,http_connection *c)

{
  int *piVar1;
  string *__rhs;
  http_connection *phVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  io_context *__args;
  bool bVar4;
  string *this_00;
  _Alloc_hider _Var5;
  size_type sVar6;
  int iVar7;
  int iVar8;
  long *plVar9;
  _Manager_type *pp_Var10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  _Alloc_hider _Var12;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar13;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar15;
  undefined4 extraout_XMM0_Db_00;
  double dVar14;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  string_view input;
  span<const_char> sVar16;
  string_view url;
  string_view url_00;
  bool local_2aa;
  undefined1 local_2a9;
  error_code ec;
  _Any_data local_298;
  _Manager_type local_288;
  long lStack_280;
  undefined1 local_278 [8];
  int *local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_258;
  string *local_250;
  string protocol;
  _Any_data local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  undefined1 local_200 [56];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  _Alloc_hider local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  _Alloc_hider local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  undefined1 local_178 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_170;
  string *local_158;
  string *psStack_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string auth;
  undefined8 *local_108;
  undefined8 uStack_100;
  code *local_f8;
  code *pcStack_f0;
  parse_state s;
  shared_ptr<libtorrent::upnp> me;
  context *local_38;
  
  _Var12._M_p = (pointer)c;
  ::std::__shared_ptr<libtorrent::upnp,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libtorrent::upnp,void>
            ((__shared_ptr<libtorrent::upnp,(__gnu_cxx::_Lock_policy)2> *)&me,
             (__weak_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2> *)this);
  phVar2 = (d->upnp_connection).
           super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar13 = extraout_XMM0_Da;
  uVar15 = extraout_XMM0_Db;
  if (phVar2 == c) {
    aux::http_connection::close(phVar2,0);
    uVar13 = 0;
    uVar15 = 0;
    p_Var3 = (d->upnp_connection).
             super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (d->upnp_connection).
    super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (d->upnp_connection).
    super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      uVar13 = extraout_XMM0_Da_00;
      uVar15 = extraout_XMM0_Db_00;
    }
  }
  if (this->m_closing != false) goto LAB_00383169;
  dVar14 = (double)CONCAT44(uVar15,uVar13);
  if (e->failed_ == true) {
    dVar14 = (double)CONCAT44(uVar15,uVar13);
    if ((DAT_004ecee8 != 0x8fafd21e25c5e09b) &&
       (dVar14 = (double)CONCAT44(uVar15,uVar13), DAT_004ecee8 != 0xb2ab117a257edf0d)) {
      dVar14 = (double)(**(code **)(boost::asio::error::get_misc_category()::instance + 0x30))
                                 (&boost::asio::error::get_misc_category()::instance,2);
    }
    if (e->val_ == 2) {
      bVar4 = e->cat_->id_ != DAT_004ecee8;
      if (DAT_004ecee8 == 0) {
        bVar4 = e->cat_ != (error_category *)&boost::asio::error::get_misc_category()::instance;
      }
      if (!bVar4) goto LAB_00382f11;
    }
    iVar7 = (*this->m_callback->_vptr_portmap_callback[1])(this->m_callback,1);
    if ((char)iVar7 != '\0') {
      (*e->cat_->_vptr_error_category[4])(&s,e->cat_,(ulong)(uint)e->val_);
      log(this,(double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
      if ((pointer *)CONCAT71(s._1_7_,s.in_service) !=
          &s.tag_stack.
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
        operator_delete((undefined1 *)CONCAT71(s._1_7_,s.in_service),
                        (ulong)((long)&(s.tag_stack.
                                        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish)->_M_len + 1));
      }
    }
  }
  else {
LAB_00382f11:
    if (p->m_state == read_body) {
      if (p->m_status_code == 200) {
        s.control_url._M_dataplus._M_p = (pointer)&s.control_url.field_2;
        s.in_service = false;
        s.tag_stack.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        s.tag_stack.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        s.tag_stack.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        s.control_url._M_string_length = 0;
        s.control_url.field_2._M_local_buf[0] = '\0';
        s.service_type._M_dataplus._M_p = (pointer)&s.service_type.field_2;
        s.service_type._M_string_length = 0;
        s.service_type.field_2._M_local_buf[0] = '\0';
        s.model._M_dataplus._M_p = (pointer)&s.model.field_2;
        s.model._M_string_length = 0;
        s.model.field_2._M_local_buf[0] = '\0';
        s.url_base._M_dataplus._M_p = (pointer)&s.url_base.field_2;
        s.url_base._M_string_length = 0;
        s.url_base.field_2._M_local_buf[0] = '\0';
        sVar16 = aux::http_parser::get_body(p);
        local_f8 = (code *)0x0;
        pcStack_f0 = (code *)0x0;
        local_108 = (undefined8 *)0x0;
        uStack_100 = 0;
        local_108 = (undefined8 *)operator_new(0x10);
        *local_108 = find_control_url;
        local_108[1] = &s;
        pcStack_f0 = ::std::
                     _Function_handler<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_std::_Bind<void_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_std::reference_wrapper<libtorrent::parse_state>))(int,_std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::parse_state_&)>_>
                     ::_M_invoke;
        local_f8 = ::std::
                   _Function_handler<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_std::_Bind<void_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_std::reference_wrapper<libtorrent::parse_state>))(int,_std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::parse_state_&)>_>
                   ::_M_manager;
        input._M_str = (char *)&local_108;
        input._M_len = (size_t)sVar16.m_ptr;
        aux::xml_parse((aux *)sVar16.m_len,input,
                       (function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                        *)&s);
        dVar14 = (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
        if (local_f8 != (code *)0x0) {
          dVar14 = (double)(*local_f8)(&local_108,&local_108,3);
        }
        if (s.control_url._M_string_length == 0) {
          log(this,dVar14);
          d->disabled = true;
        }
        else {
          ::std::__cxx11::string::_M_assign((string *)&d->service_namespace);
          if (s.model._M_string_length != 0) {
            ::std::__cxx11::string::_M_assign((string *)&this->m_model);
          }
          __rhs = &s.control_url;
          if (s.url_base._M_string_length == 0) {
LAB_003831ba:
            ::std::__cxx11::string::_M_assign((string *)&d->control_url);
          }
          else {
            ::std::__cxx11::string::substr((ulong)local_200,(ulong)__rhs);
            iVar7 = ::std::__cxx11::string::compare(local_200);
            if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
              operator_delete((void *)local_200._0_8_,(ulong)(local_200._16_8_ + 1));
            }
            if (iVar7 == 0) goto LAB_003831ba;
            if (((s.url_base._M_dataplus._M_p[s.url_base._M_string_length - 1] == '/') &&
                (s.control_url._M_string_length != 0)) && (*s.control_url._M_dataplus._M_p == '/'))
            {
              ::std::__cxx11::string::_M_erase((ulong)&s.url_base,s.url_base._M_string_length - 1);
            }
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_200,&s.url_base,__rhs);
            ::std::__cxx11::string::operator=((string *)&d->control_url,(string *)local_200);
            if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
              operator_delete((void *)local_200._0_8_,(ulong)(local_200._16_8_ + 1));
            }
          }
          protocol._M_dataplus._M_p = (pointer)&protocol.field_2;
          protocol._M_string_length = 0;
          protocol.field_2._M_local_buf[0] = '\0';
          auth._M_dataplus._M_p = (pointer)&auth.field_2;
          auth._M_string_length = 0;
          auth.field_2._M_local_buf[0] = '\0';
          ec.val_ = 0;
          ec.failed_ = false;
          ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.
                     super_error_category;
          local_250 = (string *)&d->control_url;
          if (((d->control_url)._M_string_length != 0) &&
             (*(((string *)local_250)->_M_dataplus)._M_p == '/')) {
            url._M_str = (char *)&ec;
            url._M_len = (size_t)(d->url)._M_dataplus._M_p;
            aux::parse_url_components_abi_cxx11_
                      ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_200,(aux *)(d->url)._M_string_length,url,(error_code *)_Var12._M_p);
            piVar1 = &d->port;
            local_278 = (undefined1  [8])&d->path;
            local_268._8_8_ = &auth;
            _Stack_258._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&protocol;
            local_270 = piVar1;
            local_268._M_allocated_capacity = (size_type)&d->hostname;
            ::std::
            tuple<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&,std::__cxx11::string&>
            ::operator=((tuple<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&,std::__cxx11::string&>
                         *)local_278,
                        (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_200);
            ::std::
            _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~_Tuple_impl((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_200);
            if (d->port == -1) {
              iVar8 = ::std::__cxx11::string::compare((char *)&protocol);
              iVar7 = 0x1bb;
              if (iVar8 == 0) {
                iVar7 = 0x50;
              }
              *piVar1 = iVar7;
            }
            ::std::operator+(&local_148,&protocol,"://");
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_228,&local_148,&d->hostname);
            this_00 = local_250;
            plVar9 = (long *)::std::__cxx11::string::append(local_228._M_pod_data);
            pp_Var10 = (_Manager_type *)(plVar9 + 2);
            if ((_Manager_type *)*plVar9 == pp_Var10) {
              local_288 = *pp_Var10;
              lStack_280 = plVar9[3];
              local_298._M_unused._M_object = &local_288;
            }
            else {
              local_288 = *pp_Var10;
              local_298._M_unused._M_object = (_Manager_type *)*plVar9;
            }
            local_298._8_8_ = plVar9[1];
            *plVar9 = (long)pp_Var10;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            aux::to_string((array<char,_22UL> *)local_178,(long)*piVar1);
            plVar9 = (long *)::std::__cxx11::string::append(local_298._M_pod_data);
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 == paVar11) {
              local_268._M_allocated_capacity = paVar11->_M_allocated_capacity;
              local_268._8_8_ = plVar9[3];
              local_278 = (undefined1  [8])&local_268;
            }
            else {
              local_268._M_allocated_capacity = paVar11->_M_allocated_capacity;
              local_278 = (undefined1  [8])*plVar9;
            }
            local_270 = (int *)plVar9[1];
            *plVar9 = (long)paVar11;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_200,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_278,__rhs);
            ::std::__cxx11::string::operator=(this_00,(string *)local_200);
            if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
              operator_delete((void *)local_200._0_8_,(ulong)(local_200._16_8_ + 1));
            }
            if (local_278 != (undefined1  [8])&local_268) {
              operator_delete((void *)local_278,(ulong)(local_268._M_allocated_capacity + 1));
            }
            if ((_Manager_type *)local_298._M_unused._0_8_ != &local_288) {
              operator_delete(local_298._M_unused._M_object,(ulong)(local_288 + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_unused._0_8_ != &local_218) {
              operator_delete(local_228._M_unused._M_object,
                              (ulong)(local_218._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
          }
          iVar7 = (*this->m_callback->_vptr_portmap_callback[1])(this->m_callback,1);
          if ((char)iVar7 != '\0') {
            _Var12 = s.url_base._M_dataplus;
            log(this,(double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
          }
          url_00._M_str = (char *)&ec;
          url_00._M_len = (size_t)(d->control_url)._M_dataplus._M_p;
          aux::parse_url_components_abi_cxx11_
                    ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_200,(aux *)(d->control_url)._M_string_length,url_00,
                     (error_code *)_Var12._M_p);
          piVar1 = &d->port;
          local_278 = (undefined1  [8])&d->path;
          local_268._8_8_ = &auth;
          _Stack_258._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&protocol;
          local_270 = piVar1;
          local_268._M_allocated_capacity = (size_type)&d->hostname;
          ::std::
          tuple<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&,std::__cxx11::string&>
          ::operator=((tuple<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&,std::__cxx11::string&>
                       *)local_278,
                      (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_200);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_p != &local_188) {
            operator_delete(local_198._M_p,local_188._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_p != &local_1a8) {
            operator_delete(local_1b8._M_p,local_1a8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._40_8_ != &local_1c8) {
            operator_delete((void *)local_200._40_8_,local_1c8._M_allocated_capacity + 1);
          }
          _Var12._M_p = local_200 + 0x10;
          if ((pointer)local_200._0_8_ != _Var12._M_p) {
            operator_delete((void *)local_200._0_8_,(ulong)(local_200._16_8_ + 1));
          }
          if (*piVar1 == -1) {
            iVar8 = ::std::__cxx11::string::compare((char *)&protocol);
            iVar7 = 0x1bb;
            if (iVar8 == 0) {
              iVar7 = 0x50;
            }
            *piVar1 = iVar7;
          }
          if (ec.failed_ == true) {
            iVar7 = (*this->m_callback->_vptr_portmap_callback[1])(this->m_callback,1);
            if ((char)iVar7 != '\0') {
              (*(ec.cat_)->_vptr_error_category[4])(local_200,ec.cat_,(ulong)(uint)ec.val_);
              log(this,(double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05));
              if ((pointer)local_200._0_8_ != _Var12._M_p) {
                operator_delete((void *)local_200._0_8_,(ulong)(local_200._16_8_ + 1));
              }
            }
            d->disabled = true;
          }
          else {
            phVar2 = (d->upnp_connection).
                     super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            if (phVar2 != (http_connection *)0x0) {
              aux::http_connection::close(phVar2,0);
            }
            __args = this->m_io_service;
            ::std::__shared_ptr<libtorrent::upnp,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<libtorrent::upnp,void>
                      ((__shared_ptr<libtorrent::upnp,(__gnu_cxx::_Lock_policy)2> *)local_178,
                       (__weak_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2> *)this);
            local_200._0_8_ = on_upnp_get_ip_address_response;
            local_200._8_8_ = 0;
            local_200._24_8_ = local_178;
            local_200._32_8_ = p_Stack_170;
            local_178[0] = '\0';
            local_178[1] = '\0';
            local_178[2] = '\0';
            local_178[3] = '\0';
            local_178[4] = '\0';
            local_178[5] = '\0';
            local_178[6] = '\0';
            local_178[7] = '\0';
            p_Stack_170 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_2aa = true;
            local_200._16_8_ = d;
            ::std::__shared_ptr<libtorrent::upnp,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<libtorrent::upnp,void>
                      ((__shared_ptr<libtorrent::upnp,(__gnu_cxx::_Lock_policy)2> *)&local_158,
                       (__weak_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2> *)this);
            local_278 = (undefined1  [8])get_ip_address;
            local_270 = (int *)0x0;
            local_268._8_8_ = local_158;
            _Stack_258._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psStack_150;
            local_158 = (string *)0x0;
            psStack_150 = (string *)0x0;
            local_288 = (_Manager_type)0x0;
            lStack_280 = 0;
            local_298._M_unused._M_object = (_Manager_type *)0x0;
            local_298._8_8_ = 0;
            local_218._M_allocated_capacity = 0;
            local_218._8_8_ = 0;
            local_228._M_unused._M_object =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_228._8_8_ = 0;
            local_38 = &this->m_ssl_ctx;
            local_268._M_allocated_capacity = (size_type)d;
            ::std::__shared_ptr<libtorrent::aux::http_connection,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<std::allocator<libtorrent::aux::http_connection>,boost::asio::io_context&,libtorrent::aux::resolver&,std::_Bind<void(libtorrent::upnp::*(std::shared_ptr<libtorrent::upnp>,std::_Placeholder<1>,std::_Placeholder<2>,std::reference_wrapper<libtorrent::upnp::rootdevice>,std::_Placeholder<4>))(boost::system::error_code_const&,libtorrent::aux::http_parser_const&,libtorrent::upnp::rootdevice&,libtorrent::aux::http_connection&)>,bool,int_const&,std::_Bind<void(libtorrent::upnp::*(std::shared_ptr<libtorrent::upnp>,std::reference_wrapper<libtorrent::upnp::rootdevice>))(libtorrent::upnp::rootdevice&)>,std::function<void(libtorrent::aux::http_connection&,std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>&)>,std::function<bool(libtorrent::aux::http_connection&,std::basic_string_view<char,std::char_traits<char>>)>,boost::asio::ssl::context*>
                      ((__shared_ptr<libtorrent::aux::http_connection,(__gnu_cxx::_Lock_policy)2> *)
                       &local_148,(allocator<libtorrent::aux::http_connection> *)&local_2a9,__args,
                       &this->m_resolver,
                       (_Bind<void_(libtorrent::upnp::*(std::shared_ptr<libtorrent::upnp>,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::reference_wrapper<libtorrent::upnp::rootdevice>,_std::_Placeholder<4>))(const_boost::system::error_code_&,_const_libtorrent::aux::http_parser_&,_libtorrent::upnp::rootdevice_&,_libtorrent::aux::http_connection_&)>
                        *)local_200,&local_2aa,&aux::default_max_bottled_buffer_size,
                       (_Bind<void_(libtorrent::upnp::*(std::shared_ptr<libtorrent::upnp>,_std::reference_wrapper<libtorrent::upnp::rootdevice>))(libtorrent::upnp::rootdevice_&)>
                        *)local_278,
                       (function<void_(libtorrent::aux::http_connection_&,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_&)>
                        *)&local_298,
                       (function<bool_(libtorrent::aux::http_connection_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
                        *)&local_228,&local_38);
            sVar6 = local_148._M_string_length;
            _Var5._M_p = local_148._M_dataplus._M_p;
            local_148._M_dataplus._M_p = (pointer)0x0;
            local_148._M_string_length = 0;
            p_Var3 = (d->upnp_connection).
                     super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (d->upnp_connection).
            super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 = (element_type *)_Var5._M_p;
            (d->upnp_connection).
            super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar6;
            if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._M_string_length !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_148._M_string_length);
              }
            }
            if ((code *)local_218._M_allocated_capacity != (code *)0x0) {
              (*(code *)local_218._M_allocated_capacity)(&local_228,&local_228,3);
            }
            if (local_288 != (_Manager_type)0x0) {
              (*local_288)(&local_298,&local_298,__destroy_functor);
            }
            if ((string *)_Stack_258._M_pi != (string *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_258._M_pi);
            }
            if (psStack_150 != (string *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psStack_150);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._32_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._32_8_);
            }
            if (p_Stack_170 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_170);
            }
            local_1c8._M_local_buf[8] = '\0';
            aux::http_connection::start
                      ((d->upnp_connection).
                       super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,&d->hostname,d->port,(time_duration)0x2540be400,(proxy_settings *)0x0
                       ,false,5,(optional<libtorrent::aux::bind_info_t> *)local_200,
                       (resolver_flags)0x0,(i2p_connection *)0x0);
            if (local_1c8._M_local_buf[8] == '\x01') {
              local_1c8._M_local_buf[8] = '\0';
              if ((pointer)local_200._0_8_ != _Var12._M_p) {
                operator_delete((void *)local_200._0_8_,(ulong)(local_200._16_8_ + 1));
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)auth._M_dataplus._M_p != &auth.field_2) {
            operator_delete(auth._M_dataplus._M_p,
                            CONCAT71(auth.field_2._M_allocated_capacity._1_7_,
                                     auth.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)protocol._M_dataplus._M_p != &protocol.field_2) {
            operator_delete(protocol._M_dataplus._M_p,
                            CONCAT71(protocol.field_2._M_allocated_capacity._1_7_,
                                     protocol.field_2._M_local_buf[0]) + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)s.url_base._M_dataplus._M_p != &s.url_base.field_2) {
          operator_delete(s.url_base._M_dataplus._M_p,
                          CONCAT71(s.url_base.field_2._M_allocated_capacity._1_7_,
                                   s.url_base.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)s.model._M_dataplus._M_p != &s.model.field_2) {
          operator_delete(s.model._M_dataplus._M_p,
                          CONCAT71(s.model.field_2._M_allocated_capacity._1_7_,
                                   s.model.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)s.service_type._M_dataplus._M_p != &s.service_type.field_2) {
          operator_delete(s.service_type._M_dataplus._M_p,
                          CONCAT71(s.service_type.field_2._M_allocated_capacity._1_7_,
                                   s.service_type.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)s.control_url._M_dataplus._M_p != &s.control_url.field_2) {
          operator_delete(s.control_url._M_dataplus._M_p,
                          CONCAT71(s.control_url.field_2._M_allocated_capacity._1_7_,
                                   s.control_url.field_2._M_local_buf[0]) + 1);
        }
        if (s.tag_stack.
            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(s.tag_stack.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)s.tag_stack.
                                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)s.tag_stack.
                                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        goto LAB_00383169;
      }
      iVar7 = (*this->m_callback->_vptr_portmap_callback[1])(this->m_callback,1);
      if ((char)iVar7 != '\0') {
        log(this,(double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
      }
    }
    else {
      log(this,dVar14);
    }
  }
  d->disabled = true;
LAB_00383169:
  if (me.super___shared_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (me.super___shared_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  return;
}

Assistant:

void upnp::on_upnp_xml(error_code const& e
	, aux::http_parser const& p, rootdevice& d
	, aux::http_connection& c)
{
	TORRENT_ASSERT(is_single_thread());
	std::shared_ptr<upnp> me(self());

	TORRENT_ASSERT(d.magic == 1337);
	if (d.upnp_connection && d.upnp_connection.get() == &c)
	{
		d.upnp_connection->close();
		d.upnp_connection.reset();
	}

	if (m_closing) return;

	if (e && e != boost::asio::error::eof)
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			log("error while fetching control url from: %s: %s"
				, d.url.c_str(), e.message().c_str());
		}
#endif
		d.disabled = true;
		return;
	}

	if (!p.header_finished())
	{
#ifndef TORRENT_DISABLE_LOGGING
		log("error while fetching control url from: %s: incomplete HTTP message"
			, d.url.c_str());
#endif
		d.disabled = true;
		return;
	}

	if (p.status_code() != 200)
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			log("error while fetching control url from: %s: %s"
				, d.url.c_str(), p.message().c_str());
		}
#endif
		d.disabled = true;
		return;
	}

	parse_state s;
	auto body = p.get_body();
	xml_parse({body.data(), std::size_t(body.size())}, std::bind(&find_control_url, _1, _2, std::ref(s)));
	if (s.control_url.empty())
	{
#ifndef TORRENT_DISABLE_LOGGING
		log("could not find a port mapping interface in response from: %s"
			, d.url.c_str());
#endif
		d.disabled = true;
		return;
	}
	d.service_namespace = s.service_type;

	TORRENT_ASSERT(!d.service_namespace.empty());

	if (!s.model.empty()) m_model = s.model;

	if (!s.url_base.empty() && s.control_url.substr(0, 7) != "http://")
	{
		// avoid double slashes in path
		if (s.url_base[s.url_base.size()-1] == '/'
			&& !s.control_url.empty()
			&& s.control_url[0] == '/')
			s.url_base.erase(s.url_base.end()-1);
		d.control_url = s.url_base + s.control_url;
	}
	else d.control_url = s.control_url;

	std::string protocol;
	std::string auth;
	error_code ec;
	if (!d.control_url.empty() && d.control_url[0] == '/')
	{
		std::tie(protocol, auth, d.hostname, d.port, d.path)
			= parse_url_components(d.url, ec);
		if (d.port == -1) d.port = protocol == "http" ? 80 : 443;
		d.control_url = protocol + "://" + d.hostname + ":"
			+ to_string(d.port).data() + s.control_url;
	}

#ifndef TORRENT_DISABLE_LOGGING
	if (should_log())
	{
		log("found control URL: %s namespace %s "
			"urlbase: %s in response from %s"
			, d.control_url.c_str(), d.service_namespace.c_str()
			, s.url_base.c_str(), d.url.c_str());
	}
#endif

	std::tie(protocol, auth, d.hostname, d.port, d.path)
		= parse_url_components(d.control_url, ec);
	if (d.port == -1) d.port = protocol == "http" ? 80 : 443;

	if (ec)
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			log("failed to parse URL '%s': %s"
				, d.control_url.c_str(), ec.message().c_str());
		}
#endif
		d.disabled = true;
		return;
	}

	if (d.upnp_connection) d.upnp_connection->close();
	d.upnp_connection = std::make_shared<http_connection>(m_io_service
		, m_resolver
		, std::bind(&upnp::on_upnp_get_ip_address_response, self(), _1, _2
			, std::ref(d), _4), true, default_max_bottled_buffer_size
		, std::bind(&upnp::get_ip_address, self(), std::ref(d))
		, http_filter_handler()
		, hostname_filter_handler()
#if TORRENT_USE_SSL
		, &m_ssl_ctx
#endif
		);
	d.upnp_connection->start(d.hostname, d.port, seconds(10));
}